

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3SafetyCheckOk(sqlite3 *db)

{
  int iVar1;
  char *zType;
  
  if (db == (sqlite3 *)0x0) {
    zType = "NULL";
  }
  else {
    if (db->magic == 0xa029a697) {
      return 1;
    }
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar1 == 0) {
      return 0;
    }
    zType = "unopened";
  }
  logBadConnection(zType);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckOk(sqlite3 *db){
  u32 magic;
  if( db==0 ){
    logBadConnection("NULL");
    return 0;
  }
  magic = db->magic;
  if( magic!=SQLITE_MAGIC_OPEN ){
    if( sqlite3SafetyCheckSickOrOk(db) ){
      testcase( sqlite3GlobalConfig.xLog!=0 );
      logBadConnection("unopened");
    }
    return 0;
  }else{
    return 1;
  }
}